

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
          (StencilOpState *this,VkStencilOp _failOp,VkStencilOp _passOp,VkStencilOp _depthFailOp,
          VkCompareOp _compareOp,deUint32 _compareMask,deUint32 _writeMask,deUint32 _reference)

{
  deUint32 _compareMask_local;
  VkCompareOp _compareOp_local;
  VkStencilOp _depthFailOp_local;
  VkStencilOp _passOp_local;
  VkStencilOp _failOp_local;
  StencilOpState *this_local;
  
  (this->super_VkStencilOpState).failOp = _failOp;
  (this->super_VkStencilOpState).passOp = _passOp;
  (this->super_VkStencilOpState).depthFailOp = _depthFailOp;
  (this->super_VkStencilOpState).compareOp = _compareOp;
  (this->super_VkStencilOpState).compareMask = _compareMask;
  (this->super_VkStencilOpState).writeMask = _writeMask;
  (this->super_VkStencilOpState).reference = _reference;
  return;
}

Assistant:

PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState (vk::VkStencilOp	_failOp,
																	   vk::VkStencilOp	_passOp,
																	   vk::VkStencilOp	_depthFailOp,
																	   vk::VkCompareOp	_compareOp,
																	   deUint32			_compareMask,
																	   deUint32			_writeMask,
																	   deUint32			_reference)
{
	failOp		= _failOp;
	passOp		= _passOp;
	depthFailOp	= _depthFailOp;
	compareOp	= _compareOp;

	compareMask	= _compareMask;
	writeMask	= _writeMask;
	reference	= _reference;
}